

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUpdate(TgTypeParser *this,ptree *data)

{
  type_conflict4 *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  ptree *data_00;
  type_conflict4 tVar7;
  undefined8 *puVar8;
  self_type *this_00;
  iterator iVar9;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  path_type *ppVar11;
  Ptr PVar12;
  Ptr PVar13;
  stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  path_type local_78;
  element_type *local_48;
  locale local_40 [8];
  ptree *local_38;
  
  *(undefined8 *)this = 0;
  local_38 = data;
  puVar8 = (undefined8 *)operator_new(0xa8);
  puVar8[1] = 0x100000001;
  *puVar8 = &PTR___Sp_counted_ptr_inplace_002aa5b0;
  __s = (type_conflict4 *)(puVar8 + 2);
  memset(__s,0,0x98);
  *(undefined8 **)(this + 8) = puVar8;
  *(type_conflict4 **)this = __s;
  local_78.m_value._M_dataplus._M_p = (pointer)&local_78.m_value.field_2;
  local_48 = (element_type *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"update_id","");
  local_78.m_separator = '.';
  local_78.m_start._M_current = local_78.m_value._M_dataplus._M_p;
  this_00 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(in_RDX,&local_78);
  std::locale::locale(local_40);
  std::locale::locale(&local_88.m_loc,local_40);
  tVar7 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)this_00,&local_88);
  std::locale::~locale(&local_88.m_loc);
  std::locale::~locale(local_40);
  *__s = tVar7;
  paVar1 = &local_78.m_value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"message","");
  data_00 = local_38;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetMessage((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[4];
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(puVar8 + 3) =
       sVar4;
  puVar8[4] = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"edited_message","");
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetMessage((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[6];
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(puVar8 + 5) =
       sVar4;
  puVar8[6] = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"channel_post","");
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetMessage((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[8];
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(puVar8 + 7) =
       sVar4;
  puVar8[8] = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar6 = local_48;
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"edited_channel_post","");
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetMessage((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  lVar3 = *(long *)peVar6;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x40);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x38) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x40) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"inline_query","");
  ppVar11 = &local_78;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&ppVar11->m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetInlineQuery((TgTypeParser *)&local_88,(ptree *)ppVar11);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x50);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x48) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x50) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"chosen_inline_result","");
  ppVar11 = &local_78;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&ppVar11->m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetChosenInlineResult((TgTypeParser *)&local_88,(ptree *)ppVar11);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x60);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x58) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x60) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"callback_query","");
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetCallbackQuery((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x70);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x68) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x70) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"shipping_query","");
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_78.m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    parseJsonAndGetShippingQuery((TgTypeParser *)&local_88,data_00);
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  lVar3 = *(long *)peVar6;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x80);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x78) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x80) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
  }
  local_78.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"pre_checkout_query","");
  ppVar11 = &local_78;
  iVar9 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&ppVar11->m_value);
  if (iVar9.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var10._M_pi = extraout_RDX;
  }
  else {
    PVar12 = parseJsonAndGetPreCheckoutQuery((TgTypeParser *)&local_88,(ptree *)ppVar11);
    _Var10 = PVar12.super___shared_ptr<TgBot::PreCheckoutQuery,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  p_Var5 = p_Stack_80;
  sVar4 = local_88;
  local_88 = (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int>)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x90);
  *(stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)(lVar3 + 0x88) =
       sVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x90) = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var10._M_pi = extraout_RDX_00;
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
    _Var10._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.m_value._M_dataplus._M_p);
    _Var10._M_pi = extraout_RDX_02;
  }
  PVar13.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  PVar13.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  return (Ptr)PVar13.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Update::Ptr TgTypeParser::parseJsonAndGetUpdate(const ptree& data) const {
    auto result(make_shared<Update>());
    result->updateId = data.get<int32_t>("update_id");
    result->message = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "message");
    result->editedMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_message");
    result->channelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "channel_post");
    result->editedChannelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_channel_post");
    result->inlineQuery = tryParseJson<InlineQuery>(&TgTypeParser::parseJsonAndGetInlineQuery, data, "inline_query");
    result->chosenInlineResult = tryParseJson<ChosenInlineResult>(&TgTypeParser::parseJsonAndGetChosenInlineResult, data, "chosen_inline_result");
    result->callbackQuery = tryParseJson<CallbackQuery>(&TgTypeParser::parseJsonAndGetCallbackQuery, data, "callback_query");
    result->shippingQuery = tryParseJson<ShippingQuery>(&TgTypeParser::parseJsonAndGetShippingQuery, data, "shipping_query");
    result->preCheckoutQuery = tryParseJson<PreCheckoutQuery>(&TgTypeParser::parseJsonAndGetPreCheckoutQuery, data, "pre_checkout_query");
    return result;
}